

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommaInitializer.h
# Opt level: O0

CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> * __thiscall
Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
          (CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this,Scalar *s)

{
  Scalar SVar1;
  long lVar2;
  Index IVar3;
  Scalar *pSVar4;
  Scalar *s_local;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this_local;
  
  lVar2 = this->m_col;
  IVar3 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                    (&this->m_xpr->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>)
  ;
  if (lVar2 == IVar3) {
    this->m_row = this->m_currentBlockRows + this->m_row;
    this->m_col = 0;
    this->m_currentBlockRows = 1;
    lVar2 = this->m_row;
    IVar3 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                      (&this->m_xpr->
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
    if (IVar3 <= lVar2) {
      __assert_fail("m_row<m_xpr.rows() && \"Too many rows passed to comma initializer (operator<<)\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/CommaInitializer.h"
                    ,0x49,
                    "CommaInitializer<MatrixType> &Eigen::CommaInitializer<Eigen::Matrix<double, -1, -1>>::operator,(const Scalar &) [MatrixType = Eigen::Matrix<double, -1, -1>]"
                   );
    }
  }
  lVar2 = this->m_col;
  IVar3 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                    (&this->m_xpr->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>)
  ;
  if (lVar2 < IVar3) {
    if (this->m_currentBlockRows == 1) {
      SVar1 = *s;
      lVar2 = this->m_col;
      this->m_col = lVar2 + 1;
      pSVar4 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::coeffRef
                         (&this->m_xpr->
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,
                          this->m_row,lVar2);
      *pSVar4 = SVar1;
      return this;
    }
    __assert_fail("m_currentBlockRows==1",
                  "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/CommaInitializer.h"
                  ,0x4d,
                  "CommaInitializer<MatrixType> &Eigen::CommaInitializer<Eigen::Matrix<double, -1, -1>>::operator,(const Scalar &) [MatrixType = Eigen::Matrix<double, -1, -1>]"
                 );
  }
  __assert_fail("m_col<m_xpr.cols() && \"Too many coefficients passed to comma initializer (operator<<)\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/CommaInitializer.h"
                ,0x4c,
                "CommaInitializer<MatrixType> &Eigen::CommaInitializer<Eigen::Matrix<double, -1, -1>>::operator,(const Scalar &) [MatrixType = Eigen::Matrix<double, -1, -1>]"
               );
}

Assistant:

EIGEN_DEVICE_FUNC
  CommaInitializer& operator,(const Scalar& s)
  {
    if (m_col==m_xpr.cols())
    {
      m_row+=m_currentBlockRows;
      m_col = 0;
      m_currentBlockRows = 1;
      eigen_assert(m_row<m_xpr.rows()
        && "Too many rows passed to comma initializer (operator<<)");
    }
    eigen_assert(m_col<m_xpr.cols()
      && "Too many coefficients passed to comma initializer (operator<<)");
    eigen_assert(m_currentBlockRows==1);
    m_xpr.coeffRef(m_row, m_col++) = s;
    return *this;
  }